

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int luv_fs_chown(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer lVar4;
  lua_Integer lVar5;
  uv_fs_t *req;
  luv_req_t *plVar6;
  uv_loop_t *loop;
  char *pcVar7;
  char *pcVar8;
  code *cb;
  
  pcVar3 = luaL_checklstring(L,1,(size_t *)0x0);
  lVar4 = luaL_checkinteger(L,2);
  lVar5 = luaL_checkinteger(L,3);
  iVar1 = luv_check_continuation(L,4);
  req = (uv_fs_t *)lua_newuserdata(L,0x1b8);
  plVar6 = luv_setup_req(L,iVar1);
  req->data = plVar6;
  iVar1 = plVar6->callback_ref;
  loop = luv_loop(L);
  cb = luv_fs_cb;
  if (iVar1 == -2) {
    cb = (uv_fs_cb)0x0;
  }
  iVar2 = uv_fs_chown(loop,req,pcVar3,(uv_uid_t)lVar4,(uv_gid_t)lVar5,cb);
  if ((req->fs_type == UV_FS_ACCESS) || (-1 < iVar2)) {
    if (iVar1 != -2) {
      lua_rawgeti(L,-0xf4628,(long)plVar6->req_ref);
      return 1;
    }
    iVar1 = push_fs_result(L,req);
    if (req->fs_type == UV_FS_SCANDIR) {
      return iVar1;
    }
  }
  else {
    lua_pushnil(L);
    pcVar3 = req->path;
    pcVar7 = uv_err_name((int)req->result);
    pcVar8 = uv_strerror((int)req->result);
    if (pcVar3 == (char *)0x0) {
      lua_pushfstring(L,"%s: %s",pcVar7,pcVar8);
    }
    else {
      lua_pushfstring(L,"%s: %s: %s",pcVar7,pcVar8,req->path);
    }
    iVar1 = 3;
    pcVar3 = uv_err_name((int)req->result);
    lua_pushstring(L,pcVar3);
  }
  luv_cleanup_req(L,(luv_req_t *)req->data);
  req->data = (void *)0x0;
  uv_fs_req_cleanup(req);
  return iVar1;
}

Assistant:

static int luv_fs_chown(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  const char* path = luaL_checkstring(L, 1);
  uv_uid_t uid = luaL_checkinteger(L, 2);
  uv_uid_t gid = luaL_checkinteger(L, 3);
  int ref = luv_check_continuation(L, 4);
  uv_fs_t* req = (uv_fs_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  FS_CALL(chown, req, path, uid, gid);
}